

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::_::DebugComparison<__11,int&>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
          *params)

{
  int *value;
  CappedArray<char,_14UL> *in_R8;
  Array<char> local_78;
  CappedArray<char,_14UL> local_58;
  CappedArray<char,_14UL> local_40;
  
  toCharSequence<__11&>(&local_40,this,&params->left);
  toCharSequence<int&>(&local_58,*(kj **)(this + 8),value);
  _::concat<kj::CappedArray<char,14ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            ((String *)&local_78,(_ *)&local_40,(CappedArray<char,_14UL> *)(this + 0x10),
             (StringPtr *)&local_58,in_R8);
  (__return_storage_ptr__->content).ptr = local_78.ptr;
  (__return_storage_ptr__->content).size_ = local_78.size_;
  (__return_storage_ptr__->content).disposer = local_78.disposer;
  local_78.ptr = (char *)0x0;
  local_78.size_ = 0;
  Array<char>::~Array(&local_78);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}